

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void initialization_suite::init_one(void)

{
  size_type *psVar1;
  pointer *ppiVar2;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  iterator pvVar3;
  iterator pvVar4;
  iterator pvVar5;
  iterator iVar6;
  iterator iVar7;
  int *piVar8;
  iterator iVar9;
  iterator iVar10;
  allocator<int> local_1f5;
  int local_1f4;
  iterator local_1f0;
  size_type local_1e8;
  undefined1 local_1e0 [8];
  vector<int,_std::allocator<int>_> expect_3;
  circular_view<int,_18446744073709551615UL> span_3;
  allocator<int> local_175;
  int local_174;
  iterator local_170;
  size_type local_168;
  undefined1 local_160 [8];
  vector<int,_std::allocator<int>_> expect_2;
  circular_view<int,_18446744073709551615UL> span_2;
  allocator<int> local_f5;
  int local_f4;
  iterator local_f0;
  size_type local_e8;
  undefined1 local_e0 [8];
  vector<int,_std::allocator<int>_> expect_1;
  circular_view<int,_18446744073709551615UL> span_1;
  allocator<int> local_65;
  int local_64;
  iterator local_60;
  size_type local_58;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  
  span.member.next = 0x160000000b;
  psVar1 = &span.member.next;
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar4 = std::array<int,_4UL>::end((array<int,_4UL> *)psVar1);
  pvVar5 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  vista::circular_view<int,18446744073709551615ul>::circular_view<int*>
            ((circular_view<int,18446744073709551615ul> *)
             &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,pvVar3,pvVar4,pvVar5,1);
  local_64 = 0xb;
  local_60 = &local_64;
  local_58 = 1;
  std::allocator<int>::allocator(&local_65);
  __l_02._M_len = local_58;
  __l_02._M_array = local_60;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_50,__l_02,&local_65);
  std::allocator<int>::~allocator(&local_65);
  ppiVar2 = &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar9 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar2);
  iVar10 = vista::circular_view<int,_18446744073709551615UL>::end
                     ((circular_view<int,_18446744073709551615UL> *)ppiVar2);
  iVar6 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_50);
  iVar7 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_50)
  ;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x91f,"void initialization_suite::init_one()",iVar9,iVar10,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar7._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  psVar1 = &span.member.next;
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar4 = std::array<int,_4UL>::end((array<int,_4UL> *)psVar1);
  pvVar5 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  piVar8 = std::next<int*>(pvVar5,1);
  vista::circular_view<int,18446744073709551615ul>::circular_view<int*>
            ((circular_view<int,18446744073709551615ul> *)
             &expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,pvVar3,pvVar4,piVar8,1);
  local_f4 = 0x16;
  local_f0 = &local_f4;
  local_e8 = 1;
  std::allocator<int>::allocator(&local_f5);
  __l_01._M_len = local_e8;
  __l_01._M_array = local_f0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_e0,__l_01,&local_f5);
  std::allocator<int>::~allocator(&local_f5);
  ppiVar2 = &expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar9 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar2);
  iVar10 = vista::circular_view<int,_18446744073709551615UL>::end
                     ((circular_view<int,_18446744073709551615UL> *)ppiVar2);
  iVar6 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_e0);
  iVar7 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_e0)
  ;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x926,"void initialization_suite::init_one()",iVar9,iVar10,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar7._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_e0);
  psVar1 = &span.member.next;
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar4 = std::array<int,_4UL>::end((array<int,_4UL> *)psVar1);
  pvVar5 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  piVar8 = std::next<int*>(pvVar5,2);
  vista::circular_view<int,18446744073709551615ul>::circular_view<int*>
            ((circular_view<int,18446744073709551615ul> *)
             &expect_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,pvVar3,pvVar4,piVar8,1);
  local_174 = 0x21;
  local_170 = &local_174;
  local_168 = 1;
  std::allocator<int>::allocator(&local_175);
  __l_00._M_len = local_168;
  __l_00._M_array = local_170;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_160,__l_00,&local_175);
  std::allocator<int>::~allocator(&local_175);
  ppiVar2 = &expect_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar9 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar2);
  iVar10 = vista::circular_view<int,_18446744073709551615UL>::end
                     ((circular_view<int,_18446744073709551615UL> *)ppiVar2);
  iVar6 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_160);
  iVar7 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)local_160);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x92d,"void initialization_suite::init_one()",iVar9,iVar10,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar7._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_160);
  psVar1 = &span.member.next;
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar4 = std::array<int,_4UL>::end((array<int,_4UL> *)psVar1);
  pvVar5 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  piVar8 = std::next<int*>(pvVar5,3);
  vista::circular_view<int,18446744073709551615ul>::circular_view<int*>
            ((circular_view<int,18446744073709551615ul> *)
             &expect_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,pvVar3,pvVar4,piVar8,1);
  local_1f4 = 0x2c;
  local_1f0 = &local_1f4;
  local_1e8 = 1;
  std::allocator<int>::allocator(&local_1f5);
  __l._M_len = local_1e8;
  __l._M_array = local_1f0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_1e0,__l,&local_1f5);
  std::allocator<int>::~allocator(&local_1f5);
  ppiVar2 = &expect_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar9 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar2);
  iVar10 = vista::circular_view<int,_18446744073709551615UL>::end
                     ((circular_view<int,_18446744073709551615UL> *)ppiVar2);
  iVar6 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_1e0);
  iVar7 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)local_1e0);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x934,"void initialization_suite::init_one()",iVar9,iVar10,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar7._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1e0);
  return;
}

Assistant:

void init_one()
{
    std::array<int, 4> array = { 11, 22, 33, 44 };
    {
        circular_view<int> span(array.begin(), array.end(), array.begin(), 1);

        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        circular_view<int> span(array.begin(), array.end(), std::next(array.begin(), 1), 1);

        std::vector<int> expect = { 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        circular_view<int> span(array.begin(), array.end(), std::next(array.begin(), 2), 1);

        std::vector<int> expect = { 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        circular_view<int> span(array.begin(), array.end(), std::next(array.begin(), 3), 1);

        std::vector<int> expect = { 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}